

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O2

opj_tgt_tree_t * tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v)

{
  opj_tgt_node *poVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node_t *__ptr;
  ulong uVar3;
  opj_tgt_node *poVar4;
  opj_tgt_node *poVar5;
  OPJ_UINT32 OVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
LAB_0012f134:
    p_tree = (opj_tgt_tree_t *)0x0;
  }
  else {
    uVar3 = (ulong)p_num_leafs_v;
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      l_nplh[0] = p_num_leafs_h;
      l_nplv[0] = p_num_leafs_v;
      OVar6 = 0;
      uVar12 = 0xffffffffffffffff;
      OVar2 = p_num_leafs_h;
      do {
        uVar9 = (int)uVar3 * OVar2;
        OVar2 = (int)(OVar2 + 1) / 2;
        uVar11 = (int)uVar12 + 2;
        l_nplh[uVar11] = OVar2;
        uVar3 = (long)((int)uVar3 + 1) / 2;
        l_nplv[uVar11] = (OPJ_INT32)uVar3;
        OVar6 = OVar6 + uVar9;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (1 < uVar9);
      p_tree->numnodes = OVar6;
      if (OVar6 == 0) {
LAB_0012f12c:
        tgt_destroy(p_tree);
        goto LAB_0012f134;
      }
      uVar9 = OVar6 * 0x18;
      __ptr = p_tree->nodes;
      if (p_tree->nodes_size < uVar9) {
        __ptr = (opj_tgt_node_t *)realloc(__ptr,(ulong)uVar9);
        p_tree->nodes = __ptr;
        if (__ptr == (opj_tgt_node_t *)0x0) goto LAB_0012f12c;
        memset((void *)((long)&__ptr->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar9 - p_tree->nodes_size));
        p_tree->nodes_size = uVar9;
        p_num_leafs_h = p_tree->numleafsh;
        p_num_leafs_v = p_tree->numleafsv;
      }
      poVar4 = __ptr + p_num_leafs_v * p_num_leafs_h;
      poVar5 = poVar4;
      for (uVar3 = 0; uVar3 != uVar12; uVar3 = uVar3 + 1) {
        uVar9 = l_nplv[uVar3];
        uVar7 = 0;
        uVar11 = uVar9;
        if ((int)uVar9 < 1) {
          uVar11 = uVar7;
        }
        for (; uVar7 != uVar11; uVar7 = uVar7 + 1) {
          iVar10 = l_nplh[uVar3];
          lVar8 = (long)iVar10;
          for (; 0 < iVar10; iVar10 = iVar10 + -2) {
            __ptr->parent = poVar4;
            if (iVar10 == 1) {
              __ptr = __ptr + 1;
            }
            else {
              __ptr[1].parent = poVar4;
              __ptr = __ptr + 2;
            }
            poVar4 = poVar4 + 1;
          }
          poVar1 = poVar5 + lVar8;
          if (uVar7 == uVar9 - 1 || (uVar7 & 1) != 0) {
            poVar1 = poVar4;
            poVar5 = poVar4;
          }
          poVar4 = poVar5;
          poVar5 = poVar1;
        }
      }
      __ptr->parent = (opj_tgt_node *)0x0;
    }
    tgt_reset(p_tree);
  }
  return p_tree;
}

Assistant:

opj_tgt_tree_t *tgt_init(opj_tgt_tree_t * p_tree,OPJ_UINT32 p_num_leafs_h, OPJ_UINT32 p_num_leafs_v)
{
	OPJ_INT32 l_nplh[32];
	OPJ_INT32 l_nplv[32];
	opj_tgt_node_t *l_node = 00;
	opj_tgt_node_t *l_parent_node = 00;
	opj_tgt_node_t *l_parent_node0 = 00;
	OPJ_UINT32 i;
	OPJ_INT32 j,k;
	OPJ_UINT32 l_num_levels;
	OPJ_UINT32 n;
	OPJ_UINT32 l_node_size;

	if
		(! p_tree)
	{
		return 00;
	}
	if
		((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v))
	{
		p_tree->numleafsh = p_num_leafs_h;
		p_tree->numleafsv = p_num_leafs_v;

		l_num_levels = 0;
		l_nplh[0] = p_num_leafs_h;
		l_nplv[0] = p_num_leafs_v;
		p_tree->numnodes = 0;
		do
		{
			n = l_nplh[l_num_levels] * l_nplv[l_num_levels];
			l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
			l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
			p_tree->numnodes += n;
			++l_num_levels;
		}
		while (n > 1);

		/* ADD */
		if
			(p_tree->numnodes == 0)
		{
			tgt_destroy(p_tree);
            return 00;
		}
		l_node_size = p_tree->numnodes * sizeof(opj_tgt_node_t);
		if
			(l_node_size > p_tree->nodes_size)
		{
			p_tree->nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes, l_node_size);
			if
				(! p_tree->nodes)
			{
				tgt_destroy(p_tree);
				return 00;
			}
			memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0 , l_node_size - p_tree->nodes_size);
			p_tree->nodes_size = l_node_size;
		}
		l_node = p_tree->nodes;
		l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
		l_parent_node0 = l_parent_node;

		for
			(i = 0; i < l_num_levels - 1; ++i)
		{
			for
				(j = 0; j < l_nplv[i]; ++j)
			{
				k = l_nplh[i];
				while
					(--k >= 0)
				{
					l_node->parent = l_parent_node;
					++l_node;
					if (--k >= 0)
					{
						l_node->parent = l_parent_node;
						++l_node;
					}
					++l_parent_node;
				}
				if ((j & 1) || j == l_nplv[i] - 1)
				{
					l_parent_node0 = l_parent_node;
				}
				else
				{
					l_parent_node = l_parent_node0;
					l_parent_node0 += l_nplh[i];
				}
			}
		}
		l_node->parent = 0;
	}
	tgt_reset(p_tree);

	return p_tree;
}